

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

Aig_Man_t * Saig_ManDualRail(Aig_Man_t *p,int fMiter)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  undefined8 *puVar6;
  int local_34;
  Aig_Obj_t *pAStack_30;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int fMiter_local;
  Aig_Man_t *p_local;
  
  Aig_ManCleanData(p);
  Aig_ManCleanNext(p);
  iVar2 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar2 << 2);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pAVar4 = Aig_ManConst0(p_00);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar4;
  pAVar4 = Aig_ManConst1(p_00);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_0).pNext = pAVar4;
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vCis), local_34 < iVar2; local_34 = local_34 + 1) {
    puVar6 = (undefined8 *)Vec_PtrEntry(p->vCis,local_34);
    pAVar4 = Aig_ObjCreateCi(p_00);
    puVar6[5] = pAVar4;
    pAVar4 = Aig_ObjCreateCi(p_00);
    *puVar6 = pAVar4;
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) {
      Saig_AndDualRail(p_00,pAVar4,(Aig_Obj_t **)&(pAVar4->field_5).pData,(Aig_Obj_t **)pAVar4);
    }
  }
  if (fMiter == 0) {
    for (local_34 = 0; iVar2 = Vec_PtrSize(p->vCos), local_34 < iVar2; local_34 = local_34 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
      iVar2 = Aig_ObjFaninC0(pAVar4);
      if (iVar2 == 0) {
        pAVar5 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(pAVar5->field_5).pData);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(pAVar4->field_0).pNext);
      }
      else {
        pAVar5 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(pAVar5->field_0).pNext);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(pAVar4->field_5).pData);
      }
    }
  }
  else {
    pAStack_30 = Aig_ManConst1(p_00);
    for (local_34 = 0; iVar2 = Saig_ManRegNum(p), local_34 < iVar2; local_34 = local_34 + 1) {
      pVVar1 = p->vCis;
      iVar2 = Saig_ManPiNum(p);
      puVar6 = (undefined8 *)Vec_PtrEntry(pVVar1,local_34 + iVar2);
      pAVar4 = Aig_Or(p_00,(Aig_Obj_t *)puVar6[5],(Aig_Obj_t *)*puVar6);
      pAStack_30 = Aig_And(p_00,pAStack_30,pAVar4);
    }
    Aig_ObjCreateCo(p_00,pAStack_30);
    for (local_34 = 0; iVar2 = Saig_ManRegNum(p), local_34 < iVar2; local_34 = local_34 + 1) {
      pVVar1 = p->vCos;
      iVar2 = Saig_ManPoNum(p);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_34 + iVar2);
      iVar2 = Aig_ObjFaninC0(pAVar4);
      if (iVar2 == 0) {
        pAVar5 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(pAVar5->field_5).pData);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(pAVar4->field_0).pNext);
      }
      else {
        pAVar5 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(pAVar5->field_0).pNext);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(pAVar4->field_5).pData);
      }
    }
  }
  iVar2 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar2 << 1);
  Aig_ManCleanData(p);
  Aig_ManCleanNext(p);
  Aig_ManCleanup(p_00);
  iVar2 = Aig_ManCheck(p_00);
  if (iVar2 == 0) {
    printf("Aig_ManDupSimple(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManDualRail( Aig_Man_t * p, int fMiter )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    Aig_ManCleanData( p );
    Aig_ManCleanNext( p );
    // create the new manager
    pNew = Aig_ManStart( 4*Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs 
    Aig_ManConst1(p)->pData = Aig_ManConst0(pNew);
    Aig_ManConst1(p)->pNext = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pNew );
        pObj->pNext = Aig_ObjCreateCi( pNew );
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        Saig_AndDualRail( pNew, pObj, (Aig_Obj_t **)&pObj->pData, &pObj->pNext );
    // add the POs
    if ( fMiter )
    {
        pMiter = Aig_ManConst1(pNew);
        Saig_ManForEachLo( p, pObj, i )
        {
            pMiter = Aig_And( pNew, pMiter, 
                Aig_Or(pNew, (Aig_Obj_t *)pObj->pData, pObj->pNext) );
        } 
        Aig_ObjCreateCo( pNew, pMiter );
        Saig_ManForEachLi( p, pObj, i )
        {
            if ( !Aig_ObjFaninC0(pObj) )
            {
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
            }
            else
            {
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
            }
        }
    }
    else
    {
        Aig_ManForEachCo( p, pObj, i )
        {
            if ( !Aig_ObjFaninC0(pObj) )
            {
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
            }
            else
            {
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
            }
        }
    }
    Aig_ManSetRegNum( pNew, 2*Aig_ManRegNum(p) );
    Aig_ManCleanData( p );
    Aig_ManCleanNext( p );
    Aig_ManCleanup( pNew );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}